

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsErrors.cxx
# Opt level: O2

void cmCMakePresetsErrors::INVALID_CONFIGURE_PRESET(string *presetName,cmJSONState *state)

{
  string local_30;
  
  cmStrCat<char_const(&)[29],std::__cxx11::string_const&,char_const(&)[2]>
            (&local_30,(char (*) [29])"Invalid \"configurePreset\": \"",presetName,
             (char (*) [2])0x761966);
  cmJSONState::AddError(state,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void INVALID_CONFIGURE_PRESET(const std::string& presetName,
                              cmJSONState* state)
{
  state->AddError(
    cmStrCat(R"(Invalid "configurePreset": ")", presetName, "\""));
}